

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perfect.hpp
# Opt level: O1

void __thiscall
Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>::Perfect
          (Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *this,FuncTerm *elem)

{
  anon_class_8_1_898b388d local_40;
  FuncTerm *local_38;
  FuncTerm *local_30;
  FuncTerm *local_28;
  uint *local_20;
  
  local_28 = elem;
  Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  ::tryGet((Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
            *)&local_20,(FuncTerm **)Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::_ids);
  if (local_20 == (uint *)0x0) {
    local_30 = elem;
    Perfect::anon_class_8_1_898b388d::operator()(&local_40);
  }
  else {
    local_40.elem._0_4_ = *local_20;
    local_38 = *(FuncTerm **)(local_20 + 2);
  }
  this->_id = (uint)local_40.elem;
  this->_ptr = local_38;
  return;
}

Assistant:

explicit Perfect(T elem) 
    : Perfect(_ids.tryGet(&elem).toOwned()
        .unwrapOrElse([&](){
            auto entry = Perfect(_ids.size(),  new T(std::move(elem)));
            _ids.insert(entry._ptr, entry);
            DEBUG(*elemPtr, " -> ", T::className(),"#",entry._id);
            return entry;
          })) 
    { }